

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O0

int __thiscall nuraft::raft_launcher::shutdown(raft_launcher *this,int __fd,int __how)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined7 extraout_var;
  element_type *this_00;
  element_type *peVar4;
  int __how_00;
  undefined4 in_register_00000034;
  size_t count;
  undefined7 in_stack_ffffffffffffffd0;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe0;
  ulong uVar5;
  undefined1 local_1;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->raft_instance_);
  uVar5 = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    this_00 = std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x21745d);
    raft_server::shutdown(this_00,__fd,__how_00);
    std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
              (in_stack_ffffffffffffffe0);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->asio_listener_);
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x217495);
      (*peVar4->_vptr_rpc_listener[3])();
      peVar4 = std::
               __shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2174ac);
      (*peVar4->_vptr_rpc_listener[4])();
    }
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar2) {
      std::__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2174cf);
      asio_service::stop((asio_service *)0x2174d7);
      uVar5 = 0;
      while( true ) {
        std::__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2174ea);
        uVar3 = asio_service::get_active_workers((asio_service *)this);
        bVar2 = uVar5 < (ulong)(lVar1 * 100);
        if (uVar3 == 0 || !bVar2) break;
        timer_helper::sleep_ms(CONCAT17(uVar3 != 0 && bVar2,in_stack_ffffffffffffffd0));
        uVar5 = uVar5 + 1;
      }
    }
    std::__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x217544);
    uVar3 = asio_service::get_active_workers((asio_service *)this);
    uVar5 = (ulong)uVar3;
    if (uVar3 == 0) {
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),local_1);
}

Assistant:

bool raft_launcher::shutdown(size_t time_limit_sec) {
    if (!raft_instance_) return false;

    raft_instance_->shutdown();
    raft_instance_.reset();

    if (asio_listener_) {
        asio_listener_->stop();
        asio_listener_->shutdown();
    }
    if (asio_svc_) {
        asio_svc_->stop();
        size_t count = 0;
        while ( asio_svc_->get_active_workers() &&
                count < time_limit_sec * 100 ) {
            // 10ms per tick.
            timer_helper::sleep_ms(10);
            count++;
        }
    }
    if (asio_svc_->get_active_workers()) return false;
    return true;
}